

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::~tree_clusterizer
          (tree_clusterizer<crnlib::vec<16U,_float>_> *this)

{
  hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
  *phVar1;
  vec<16U,_float> *pvVar2;
  vq_node *p;
  raw_node *prVar3;
  bool *p_00;
  VectorInfo *pVVar4;
  double *p_01;
  
  pvVar2 = (this->m_codebook).m_p;
  if (pvVar2 != (vec<16U,_float> *)0x0) {
    crnlib_free(pvVar2);
  }
  p = (this->m_nodes).m_p;
  if (p != (vq_node *)0x0) {
    crnlib_free(p);
  }
  phVar1 = &this->m_node_index_map;
  if ((this->m_node_index_map).m_values.m_size != 0) {
    prVar3 = (phVar1->m_values).m_p;
    if (prVar3 != (raw_node *)0x0) {
      crnlib_free(prVar3);
      (phVar1->m_values).m_p = (raw_node *)0x0;
      (this->m_node_index_map).m_values.m_size = 0;
      (this->m_node_index_map).m_values.m_capacity = 0;
    }
    (this->m_node_index_map).m_hash_shift = 0x20;
    (this->m_node_index_map).m_num_valid = 0;
    (this->m_node_index_map).m_grow_threshold = 0;
  }
  prVar3 = (phVar1->m_values).m_p;
  if (prVar3 != (raw_node *)0x0) {
    crnlib_free(prVar3);
  }
  p_00 = (this->m_vectorComparison).m_p;
  if (p_00 != (bool *)0x0) {
    crnlib_free(p_00);
  }
  pVVar4 = (this->m_vectorsInfoRight).m_p;
  if (pVVar4 != (VectorInfo *)0x0) {
    crnlib_free(pVVar4);
  }
  pVVar4 = (this->m_vectorsInfoLeft).m_p;
  if (pVVar4 != (VectorInfo *)0x0) {
    crnlib_free(pVVar4);
  }
  pVVar4 = (this->m_vectorsInfo).m_p;
  if (pVVar4 != (VectorInfo *)0x0) {
    crnlib_free(pVVar4);
  }
  p_01 = (this->m_weightedDotProducts).m_p;
  if (p_01 != (double *)0x0) {
    crnlib_free(p_01);
  }
  pvVar2 = (this->m_weightedVectors).m_p;
  if (pvVar2 != (vec<16U,_float> *)0x0) {
    crnlib_free(pvVar2);
  }
  return;
}

Assistant:

tree_clusterizer() {}